

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (char *test_case_name,char *name,char *type_param,char *value_param,
          CodeLocation *code_location,TypeId fixture_class_id,SetUpTestCaseFunc set_up_tc,
          TearDownTestCaseFunc tear_down_tc,TestFactoryBase *factory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  TestInfo *test_info;
  allocator local_a2;
  allocator local_a1;
  TestInfo *local_a0;
  CodeLocation local_98;
  string local_70;
  string local_50;
  
  local_a0 = (TestInfo *)operator_new(0x108);
  std::__cxx11::string::string((string *)&local_50,test_case_name,&local_a1);
  std::__cxx11::string::string((string *)&local_70,name,&local_a2);
  paVar1 = &local_98.file.field_2;
  pcVar2 = (code_location->file)._M_dataplus._M_p;
  local_98.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + (code_location->file)._M_string_length);
  test_info = local_a0;
  local_98.line = code_location->line;
  TestInfo::TestInfo(local_a0,&local_50,&local_70,type_param,value_param,&local_98,fixture_class_id,
                     factory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  UnitTest::GetInstance();
  UnitTestImpl::AddTestInfo(UnitTest::GetInstance::instance.impl_,set_up_tc,tear_down_tc,test_info);
  return test_info;
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    const char* test_case_name,
    const char* name,
    const char* type_param,
    const char* value_param,
    CodeLocation code_location,
    TypeId fixture_class_id,
    SetUpTestCaseFunc set_up_tc,
    TearDownTestCaseFunc tear_down_tc,
    TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(test_case_name, name, type_param, value_param,
                   code_location, fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}